

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O0

size_t __thiscall
capnp::_::anon_unknown_0::TestInputStream::tryRead
          (TestInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  size_t local_58;
  size_t amount;
  Fault local_30;
  Fault f;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  TestInputStream *this_local;
  
  f.exception = (Exception *)maxBytes;
  if ((ulong)((long)this->end - (long)this->pos) < maxBytes) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-test.c++"
               ,0xe1,FAILED,"maxBytes <= size_t(end - pos)","\"Overran end of stream.\"",
               (char (*) [23])"Overran end of stream.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  local_58 = maxBytes;
  if ((this->lazy & 1U) != 0) {
    local_58 = minBytes;
  }
  memcpy(buffer,this->pos,local_58);
  this->pos = this->pos + local_58;
  return local_58;
}

Assistant:

size_t tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_ASSERT(maxBytes <= size_t(end - pos), "Overran end of stream.");
    size_t amount = lazy ? minBytes : maxBytes;
    memcpy(buffer, pos, amount);
    pos += amount;
    return amount;
  }